

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.h
# Opt level: O0

void __thiscall cfd::CoinSelection::~CoinSelection(CoinSelection *this)

{
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x288f72)
  ;
  return;
}

Assistant:

class CFD_EXPORT CoinSelection {
 public:
  /**
   * @brief Constructor
   */
  CoinSelection();

  /**
   * @brief Constructor
   * @param[in] use_bnb
   */
  explicit CoinSelection(bool use_bnb);

  /**
   * @brief Select the smallest Coin.
   * @param[in] target_value    Collection amount
   * @param[in] utxos           List of UTXOs to be searched
   * @param[in] filter          UTXO collection filter (reserved)
   * @param[in] option_params   collect Option
   * @param[in] tx_fee_value    transaction fee information
   * @param[out] select_value   Total collection amount
   * @param[out] utxo_fee_value the fee amount for utxo
   * @param[out] searched_bnb   Flag of whether you searched with BnB
   * @return UTXO list. If it is empty, the error ends.
   */
  std::vector<Utxo> SelectCoins(
      const Amount& target_value, const std::vector<Utxo>& utxos,
      const UtxoFilter& filter, const CoinSelectionOption& option_params,
      const Amount& tx_fee_value, Amount* select_value,
      Amount* utxo_fee_value = nullptr, bool* searched_bnb = nullptr);

#ifndef CFD_DISABLE_ELEMENTS
  /**
   * @brief Select the smallest Coin. (Multi-asset version)
   * @details CoinSelection is performed on utxos with the asset id \
   *    specified by the key of map_target_value. \
   *    In addition, if fee asset is specified in option_param, \
   *    CoinSelection for the target asset is also executed.
   * @param[in] map_target_value  Collection amount map for each Asset.
   *    For bitcoin, set the key to an empty string
   * @param[in,out] utxos         List of UTXOs to be searched
   * @param[in] filter            UTXO collection filter (reserved)
   * @param[in] option_params     collect Option
   * @param[in] tx_fee_value      transaction fee information
   * @param[out] map_select_value Total collection amount map.
   *   The collection amount for each Asset specified by map_target_value is stored.
   * @param[out] utxo_fee_value   the fee amount for utxo
   * @param[out] map_searched_bnb Flag of whether you searched with BnB.
   *   The result is stored for each Asset specified by map_target_value.
   * @param[out] map_utxo_fee_value Fee utxo amount map.
   *   The collection amount for each Asset specified by map_target_value is stored.
   * @return UTXO list. If it is empty, the error ends.
   */
  std::vector<Utxo> SelectCoins(
      const AmountMap& map_target_value, const std::vector<Utxo>& utxos,
      const UtxoFilter& filter, const CoinSelectionOption& option_params,
      const Amount& tx_fee_value, AmountMap* map_select_value,
      Amount* utxo_fee_value = nullptr,
      std::map<std::string, bool>* map_searched_bnb = nullptr,
      AmountMap* map_utxo_fee_value = nullptr);
#endif  // CFD_DISABLE_ELEMENTS

  /**
   * @brief Conversion to UTXO structure.
   * @param[in] txid                txid
   * @param[in] vout                vout
   * @param[in] output_descriptor   output descriptor
   * @param[in] amount              amount
   * @param[in] asset               asset
   * @param[in] binary_data         Any data address
   * @param[out] utxo               Converted UTXO
   * @param[in] scriptsig_template  scriptsig template
   */
  static void ConvertToUtxo(
      const Txid& txid, uint32_t vout, const std::string& output_descriptor,
      const Amount& amount, const std::string& asset, const void* binary_data,
      Utxo* utxo, const Script* scriptsig_template = nullptr);

  /**
   * @brief Conversion to UTXO structure.
   * @param[in] block_height        block height
   * @param[in] block_hash          block hash
   * @param[in] txid                txid
   * @param[in] vout                vout
   * @param[in] locking_script      locking script
   * @param[in] output_descriptor   output descriptor
   * @param[in] amount              amount
   * @param[in] binary_data         Any data address
   * @param[out] utxo               Converted UTXO
   * @param[in] scriptsig_template  scriptsig template
   */
  static void ConvertToUtxo(
      uint64_t block_height, const BlockHash& block_hash, const Txid& txid,
      uint32_t vout, const Script& locking_script,
      const std::string& output_descriptor, const Amount& amount,
      const void* binary_data, Utxo* utxo,
      const Script* scriptsig_template = nullptr);

#ifndef CFD_DISABLE_ELEMENTS
  /**
   * @brief Conversion to UTXO structure.
   * @param[in] block_height        block height
   * @param[in] block_hash          block hash
   * @param[in] txid                txid
   * @param[in] vout                vout
   * @param[in] locking_script      locking script
   * @param[in] output_descriptor   output descriptor
   * @param[in] amount              amount
   * @param[in] asset               asset
   * @param[in] binary_data         Any data address
   * @param[out] utxo               Converted UTXO
   * @param[in] scriptsig_template  scriptsig template
   */
  static void ConvertToUtxo(
      uint64_t block_height, const BlockHash& block_hash, const Txid& txid,
      uint32_t vout, const Script& locking_script,
      const std::string& output_descriptor, const Amount& amount,
      const ConfidentialAssetId& asset, const void* binary_data, Utxo* utxo,
      const Script* scriptsig_template = nullptr);
#endif  // CFD_DISABLE_ELEMENTS

 protected:
  /**
   * @brief Select the smallest Coin.
   * @details For utxo specified by utxos, it is not assumed that \
   *    multiple assets will be input. Therefore, if a utxo with \
   *    a mixture of multiple assets is input, there is a possibility \
   *    that multiple assets will be mixed in the returned utxo.
   * @param[in] target_value    Collection amount
   * @param[in] utxos           List of UTXOs to be searched
   * @param[in] filter          UTXO collection filter (reserved)
   * @param[in] option_params   collect Option
   * @param[in] tx_fee_value    transaction fee information
   * @param[in] consider_fee    \
   *    Coin Selection implementation flag considering fee (default: true)
   * @param[out] select_value   Total collection amount
   * @param[out] utxo_fee_value the fee amount for utxo
   * @param[out] searched_bnb   Flag of whether you searched with BnB
   * @return UTXO list. If it is empty, the error ends.
   */
  std::vector<Utxo> SelectCoinsMinConf(
      const int64_t& target_value, const std::vector<Utxo*>& utxos,
      const UtxoFilter& filter, const CoinSelectionOption& option_params,
      const Amount& tx_fee_value, const bool consider_fee,
      int64_t* select_value, Amount* utxo_fee_value = nullptr,
      bool* searched_bnb = nullptr);

  /**
   * @brief Perform Coin Selection (BnB).
   * @param[in] target_value      Collection amount
   * @param[in] utxos             List of UTXOs to be searched
   * @param[in] cost_of_change    Cost change range.
   *    target_value + This value is the upper limit of collection.
   * @param[in] not_input_fees    Fee amount excluding TxIn part
   * @param[in] ignore_error      ignore throw exception.
   * @param[out] select_value     Total collection amount
   * @param[out] utxo_fee_value   the fee amount for utxo
   * @return UTXO list. If it is empty, the error ends.
   */
  std::vector<Utxo> SelectCoinsBnB(
      const int64_t& target_value, const std::vector<Utxo*>& utxos,
      const int64_t& cost_of_change, const Amount& not_input_fees,
      bool ignore_error, int64_t* select_value, Amount* utxo_fee_value);

  /**
   * @brief Perform Coin Selection (Knapsack Solver).
   * @param[in] target_value      Collection amount
   * @param[in] utxos             List of UTXOs to be searched
   * @param[in] min_change        Minimum change amount
   * @param[out] select_value     Total collection amount
   * @param[out] utxo_fee_value   the fee amount for utxo
   * @return UTXO list. If it is empty, the error ends.
   */
  std::vector<Utxo> KnapsackSolver(
      const int64_t& target_value, const std::vector<Utxo*>& utxos,
      uint64_t min_change, int64_t* select_value, Amount* utxo_fee_value);

 private:
  bool use_bnb_;                       //!< BnB using flag
  std::vector<bool> randomize_cache_;  //!< randomize cache

  /**
   * Determine the UTXO list with the total amount closest to the collected amount
   * @param[in]  utxos          UTXO list smaller than the collected amount
   * @param[in]  n_total_value  Total amount of utxo list
   * @param[in]  n_target_value Collection amount
   * @param[out] vf_best        List of flags to be collected
   * @param[out] n_best         Total amount closest to the collected amount
   * @param[in]  iterations     Number of repetitions
   */
  void ApproximateBestSubset(
      const std::vector<const Utxo*>& utxos, int64_t n_total_value,
      int64_t n_target_value, std::vector<char>* vf_best, int64_t* n_best,
      int iterations);
}